

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

RuntimeError * __thiscall
jsonnet::internal::anon_unknown_0::Stack::makeError(Stack *this,LocationRange *loc,string *msg)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  long lVar4;
  TraceFrame *in_RSI;
  LocationRange *in_RDI;
  value_type *f;
  int i;
  vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_> stack_trace;
  value_type *in_stack_fffffffffffffe28;
  value_type *__x;
  TraceFrame *in_stack_fffffffffffffe30;
  TraceFrame *this_00;
  LocationRange *location;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
  *in_stack_fffffffffffffe78;
  vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
  *in_stack_fffffffffffffe80;
  string local_178 [128];
  string local_f8 [32];
  reference local_d8;
  int local_d0;
  allocator<char> local_b9;
  string local_b8 [112];
  HeapEntity *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc4;
  pointer in_stack_ffffffffffffffc8;
  
  location = in_RDI;
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::vector
            ((vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
              *)0x23260e);
  __a = &local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,__a);
  TraceFrame::TraceFrame(in_RSI,location,&in_RDI->file);
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
  push_back((vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_> *
            )in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  TraceFrame::~TraceFrame(in_stack_fffffffffffffe30);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  sVar2 = std::
          vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
          ::size((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                  *)&(in_RSI->location).file.field_2);
  local_d0 = (int)sVar2;
  while (local_d0 = local_d0 + -1, -1 < local_d0) {
    local_d8 = std::
               vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                             *)&(in_RSI->location).file.field_2,(long)local_d0);
    bVar1 = Frame::isCall(local_d8);
    if (bVar1) {
      if (local_d8->context != (HeapEntity *)0x0) {
        (anonymous_namespace)::Stack::getName_abi_cxx11_
                  ((Stack *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                   in_stack_ffffffffffffffb8);
        sVar2 = std::
                vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
                ::size((vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
                        *)&stack0xffffffffffffffc8);
        pvVar3 = std::
                 vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
                 ::operator[]((vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
                               *)&stack0xffffffffffffffc8,sVar2 - 1);
        std::__cxx11::string::operator=((string *)&pvVar3->name,local_f8);
        std::__cxx11::string::~string(local_f8);
      }
      bVar1 = LocationRange::isSet((LocationRange *)0x232824);
      if ((bVar1) || (lVar4 = std::__cxx11::string::length(), lVar4 != 0)) {
        __x = (value_type *)&local_d8->location;
        this_00 = (TraceFrame *)&stack0xfffffffffffffe87;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,__a);
        TraceFrame::TraceFrame(in_RSI,location,&in_RDI->file);
        std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
        push_back((vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
                   *)this_00,__x);
        TraceFrame::~TraceFrame(this_00);
        std::__cxx11::string::~string(local_178);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe87);
      }
    }
  }
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::vector
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  RuntimeError::RuntimeError
            ((RuntimeError *)in_RSI,
             (vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
              *)location,&in_RDI->file);
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
  ~vector((vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_> *)
          in_RDI);
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
  ~vector((vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_> *)
          in_RDI);
  return (RuntimeError *)location;
}

Assistant:

RuntimeError makeError(const LocationRange &loc, const std::string &msg)
    {
        std::vector<TraceFrame> stack_trace;
        stack_trace.push_back(TraceFrame(loc));
        for (int i = stack.size() - 1; i >= 0; --i) {
            const auto &f = stack[i];
            if (f.isCall()) {
                if (f.context != nullptr) {
                    // Give the last line a name.
                    stack_trace[stack_trace.size() - 1].name = getName(i, f.context);
                }
                if (f.location.isSet() || f.location.file.length() > 0)
                    stack_trace.push_back(TraceFrame(f.location));
            }
        }
        return RuntimeError(stack_trace, msg);
    }